

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

istream * camp::operator>>(istream *stream,Value *value)

{
  istream *piVar1;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Value local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  piVar1 = std::operator>>(stream,(string *)&local_68);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    Value::Value<std::__cxx11::string>(&local_48,&local_68);
    Value::operator=(value,&local_48);
    boost::
    variant<camp::NoType,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_camp::EnumObject,_camp::UserObject>
    ::destroy_content(&local_48.m_value);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, Value& value)
{
    // Use the string conversion
    std::string str;
    if (stream >> str)
        value = str;

    return stream;
}